

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

schar fillholetyp(int x,int y)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  uint *puVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  uVar3 = 2;
  if (2 < x) {
    uVar3 = x;
  }
  iVar8 = 0x4e;
  if (x < 0x4e) {
    iVar8 = x;
  }
  iVar6 = 0;
  iVar13 = 0;
  iVar14 = 0;
  iVar5 = 0;
  if ((int)(uVar3 - 1) <= iVar8 + 1) {
    iVar4 = 0x13;
    if (y < 0x13) {
      iVar4 = y;
    }
    uVar10 = 1;
    if (1 < y) {
      uVar10 = (ulong)(uint)y;
    }
    puVar9 = (uint *)((long)level + (ulong)uVar3 * 0xfc + uVar10 * 0xc + -0xc2);
    iVar5 = 0;
    iVar14 = 0;
    iVar6 = 0;
    lVar7 = (ulong)uVar3 - 1;
    do {
      puVar11 = puVar9;
      lVar12 = uVar10 - 2;
      if ((int)uVar10 + -1 <= iVar4 + 1) {
        do {
          cVar1 = *(char *)((long)puVar11 + -2);
          switch(cVar1) {
          case '\x11':
            iVar6 = iVar6 + 1;
            break;
          case '\x12':
switchD_001649e2_caseD_12:
            iVar13 = iVar13 + 1;
            break;
          case '\x13':
            break;
          case '\x14':
            if ((*puVar11 & 0x1c0) == 0) goto switchD_001649e2_caseD_12;
            if (cVar1 == '#') goto LAB_001649ee;
            if (cVar1 == '\x15') {
switchD_001649e2_caseD_15:
              iVar14 = iVar14 + 1;
            }
            else if (cVar1 == '\x14') {
              if ((*puVar11 & 0x1c0) == 0x40) goto switchD_001649e2_caseD_15;
              if ((*puVar11 & 0x1c0) == 0x100) goto LAB_001649ee;
            }
            break;
          case '\x15':
            goto switchD_001649e2_caseD_15;
          default:
            if (cVar1 == '#') {
LAB_001649ee:
              iVar5 = iVar5 + 1;
            }
          }
          lVar12 = lVar12 + 1;
          puVar11 = puVar11 + 3;
        } while (lVar12 <= iVar4);
      }
      puVar9 = puVar9 + 0x3f;
      bVar2 = lVar7 <= iVar8;
      lVar7 = lVar7 + 1;
    } while (bVar2);
  }
  if ((iVar13 + iVar6 / 3 < iVar14) &&
     (uVar3 = mt_random(), SUB168(ZEXT416(uVar3) % SEXT816((long)(iVar14 + 1)),0) != 0)) {
    return '\x15';
  }
  if ((0 < iVar13) && (uVar3 = mt_random(), uVar3 % (iVar13 + 1U) != 0)) {
    return '\x12';
  }
  if ((2 < iVar6) && (uVar3 = mt_random(), uVar3 % (iVar6 / 3 + 1U) != 0)) {
    return '\x11';
  }
  if ((0 < iVar5) && (uVar3 = mt_random(), uVar3 % (iVar5 + 1U) != 0)) {
    return '#';
  }
  return '\x19';
}

Assistant:

schar fillholetyp(int x, int y)
{
    int x1, y1;
    int lo_x = max(1,x-1), hi_x = min(x+1,COLNO-1),
	lo_y = max(0,y-1), hi_y = min(y+1,ROWNO-1);
    int pool_cnt = 0, moat_cnt = 0, lava_cnt = 0, swamp_cnt = 0;

    /* count the terrain types at and around x,y including those under drawbridges */
    for (x1 = lo_x; x1 <= hi_x; x1++)
	for (y1 = lo_y; y1 <= hi_y; y1++)
	    if (level->locations[x1][y1].typ == POOL)
		pool_cnt++;
	    else if (level->locations[x1][y1].typ == MOAT ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_MOAT))
		moat_cnt++;
	    else if (level->locations[x1][y1].typ == LAVAPOOL ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_LAVA))
		lava_cnt++;
	    else if (level->locations[x1][y1].typ == BOG ||
		    (level->locations[x1][y1].typ == DRAWBRIDGE_UP &&
			(level->locations[x1][y1].drawbridgemask & DB_UNDER) == DB_BOG))
		swamp_cnt++;
    pool_cnt /= 3;		/* not as much liquid as the others */

    if (lava_cnt > moat_cnt + pool_cnt && rn2(lava_cnt + 1))
	return LAVAPOOL;
    else if (moat_cnt > 0 && rn2(moat_cnt + 1))
	return MOAT;
    else if (pool_cnt > 0 && rn2(pool_cnt + 1))
	return POOL;
    else if (swamp_cnt > 0 && rn2(swamp_cnt + 1))
	return BOG;
    else
	return ROOM;
}